

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  byte bVar1;
  ptls_context_t *ppVar2;
  st_ptls_log_event_t *psVar3;
  char *pcVar4;
  size_t sVar5;
  char hexbuf [129];
  char local_98 [144];
  
  ppVar2 = tls->ctx;
  if (ppVar2->log_event != (ptls_log_event_t *)0x0) {
    pcVar4 = local_98;
    if (secret.len != 0) {
      sVar5 = 0;
      pcVar4 = local_98;
      do {
        bVar1 = secret.base[sVar5];
        *pcVar4 = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x20];
        pcVar4[1] = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x20];
        pcVar4 = pcVar4 + 2;
        sVar5 = sVar5 + 1;
      } while (secret.len != sVar5);
    }
    *pcVar4 = '\0';
    psVar3 = ppVar2->log_event;
    (*psVar3->cb)(psVar3,tls,type,"%s",local_98);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    if (tls->ctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret.base, secret.len);
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", hexbuf);
    }
}